

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void ggml_vec_dot_f16_unroll(int n,int xs,float *s,void *xv,ggml_fp16_t *y)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 (*pauVar12) [32];
  undefined8 *puVar13;
  float *pfVar14;
  long in_RCX;
  long lVar15;
  long lVar16;
  long in_RDX;
  int in_ESI;
  uint in_EDI;
  long in_R8;
  float fVar17;
  float fVar19;
  float fVar20;
  undefined1 auVar18 [16];
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  int i_6;
  int j_1;
  int i_5;
  __m128 t1;
  __m128 t0;
  int i_4;
  int i_3;
  int i_2;
  int k_1;
  int k;
  int j;
  int i_1;
  __m256 ay [4];
  __m256 ax [4];
  __m256 sum [2] [4];
  int np;
  int i;
  ggml_fp16_t *x [2];
  ggml_float sumf [2];
  int local_50c;
  int local_508;
  uint local_504;
  undefined8 local_500;
  undefined8 uStack_4f8;
  int local_4dc;
  int local_4d8;
  int local_4d4;
  int local_4d0;
  int local_4cc;
  int local_4c8;
  int local_4c4;
  undefined8 local_4c0 [16];
  undefined8 local_440 [16];
  undefined1 local_3c0 [4];
  float fStack_3bc;
  undefined8 uStack_3b8;
  float afStack_3b0 [2];
  undefined8 uStack_3a8;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  uint local_2a8;
  int local_2a4;
  long alStack_2a0 [2];
  double local_290 [2];
  long local_280;
  long local_278;
  long local_270;
  int local_268;
  uint local_264;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined1 local_230 [16];
  undefined1 local_220 [32];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  float local_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined1 (*local_170) [16];
  undefined1 (*local_168) [16];
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_280 = in_R8;
  local_278 = in_RCX;
  local_270 = in_RDX;
  local_268 = in_ESI;
  local_264 = in_EDI;
  memset(local_290,0,0x10);
  for (local_2a4 = 0; local_2a4 < 2; local_2a4 = local_2a4 + 1) {
    alStack_2a0[local_2a4] = local_278 + local_2a4 * local_268;
  }
  local_2a8 = local_264 & 0xffffffe0;
  auVar18 = ZEXT816(0) << 0x40;
  local_2e0 = ZEXT1632(auVar18);
  local_300 = ZEXT1632(auVar18);
  local_320 = local_300;
  local_340 = local_300;
  local_360 = local_300;
  local_380 = ZEXT1632(auVar18);
  local_3a0 = ZEXT1632(auVar18);
  local_220 = ZEXT432(0) << 0x40;
  _local_3c0 = ZEXT432(0) << 0x40;
  for (local_4c4 = 0; local_4c4 < (int)(local_264 & 0xffffffe0); local_4c4 = local_4c4 + 0x20) {
    for (local_4c8 = 0; local_4c8 < 4; local_4c8 = local_4c8 + 1) {
      local_168 = (undefined1 (*) [16])
                  (local_280 + (long)local_4c4 * 2 + (long)(local_4c8 << 3) * 2);
      local_150 = *(undefined8 *)*local_168;
      uStack_148 = *(undefined8 *)(*local_168 + 8);
      auVar1 = vcvtph2ps_f16c(*local_168);
      *(undefined1 (*) [32])(local_4c0 + (long)local_4c8 * 4) = auVar1;
      for (local_4cc = 0; local_4cc < 2; local_4cc = local_4cc + 1) {
        local_170 = (undefined1 (*) [16])
                    (alStack_2a0[local_4cc] + (long)local_4c4 * 2 + (long)(local_4c8 << 3) * 2);
        local_160 = *(undefined8 *)*local_170;
        uStack_158 = *(undefined8 *)(*local_170 + 8);
        auVar1 = vcvtph2ps_f16c(*local_170);
        *(undefined1 (*) [32])(local_440 + (long)local_4c8 * 4) = auVar1;
        lVar15 = (long)local_4c8;
        lVar16 = (long)local_4c8;
        pauVar12 = (undefined1 (*) [32])
                   (local_3c0 + (long)local_4c8 * 0x20 + (long)local_4cc * 0x80);
        local_1c0 = local_440[lVar15 * 4];
        uStack_1b8 = local_440[lVar15 * 4 + 1];
        uStack_1b0 = local_440[lVar15 * 4 + 2];
        uStack_1a8 = local_440[lVar15 * 4 + 3];
        local_1e0 = local_4c0[lVar16 * 4];
        uStack_1d8 = local_4c0[lVar16 * 4 + 1];
        uStack_1d0 = local_4c0[lVar16 * 4 + 2];
        uStack_1c8 = local_4c0[lVar16 * 4 + 3];
        local_200 = *(undefined8 *)*pauVar12;
        uStack_1f8 = *(undefined8 *)(*pauVar12 + 8);
        uStack_1f0 = *(undefined8 *)(*pauVar12 + 0x10);
        uStack_1e8 = *(undefined8 *)(*pauVar12 + 0x18);
        auVar2._8_8_ = local_440[lVar15 * 4 + 1];
        auVar2._0_8_ = local_440[lVar15 * 4];
        auVar2._16_8_ = local_440[lVar15 * 4 + 2];
        auVar2._24_8_ = local_440[lVar15 * 4 + 3];
        auVar1._8_8_ = local_4c0[lVar16 * 4 + 1];
        auVar1._0_8_ = local_4c0[lVar16 * 4];
        auVar1._16_8_ = local_4c0[lVar16 * 4 + 2];
        auVar1._24_8_ = local_4c0[lVar16 * 4 + 3];
        auVar18 = vfmadd213ps_fma(auVar1,auVar2,*pauVar12);
        *(undefined1 (*) [32])(local_3c0 + (long)local_4c8 * 0x20 + (long)local_4cc * 0x80) =
             ZEXT1632(auVar18);
      }
    }
  }
  for (local_4d0 = 0; local_4d0 < 2; local_4d0 = local_4d0 + 1) {
    for (local_4d4 = 0; local_4d4 < 2; local_4d4 = local_4d4 + 1) {
      puVar13 = (undefined8 *)(local_3c0 + (long)(local_4d4 << 1) * 0x20 + (long)local_4d0 * 0x80);
      local_a0 = *puVar13;
      uStack_98 = puVar13[1];
      uStack_90 = puVar13[2];
      uStack_88 = puVar13[3];
      puVar13 = (undefined8 *)
                (local_3c0 + (long)(local_4d4 * 2 + 1) * 0x20 + (long)local_4d0 * 0x80);
      local_c0 = *puVar13;
      uStack_b8 = puVar13[1];
      uStack_b0 = puVar13[2];
      uStack_a8 = puVar13[3];
      uVar8 = local_a0;
      uVar9 = uStack_98;
      uVar10 = uStack_90;
      uVar11 = uStack_88;
      uVar4 = local_c0;
      uVar5 = uStack_b8;
      uVar6 = uStack_b0;
      uVar7 = uStack_a8;
      local_a0._4_4_ = (float)((ulong)local_a0 >> 0x20);
      uStack_98._4_4_ = (float)((ulong)uStack_98 >> 0x20);
      uStack_90._4_4_ = (float)((ulong)uStack_90 >> 0x20);
      uStack_88._4_4_ = (float)((ulong)uStack_88 >> 0x20);
      local_c0._4_4_ = (float)((ulong)local_c0 >> 0x20);
      uStack_b8._4_4_ = (float)((ulong)uStack_b8 >> 0x20);
      uStack_b0._4_4_ = (float)((ulong)uStack_b0 >> 0x20);
      uStack_a8._4_4_ = (float)((ulong)uStack_a8 >> 0x20);
      pfVar14 = (float *)(local_3c0 + (long)(local_4d4 << 1) * 0x20 + (long)local_4d0 * 0x80);
      *pfVar14 = (float)local_a0 + (float)local_c0;
      pfVar14[1] = local_a0._4_4_ + local_c0._4_4_;
      pfVar14[2] = (float)uStack_98 + (float)uStack_b8;
      pfVar14[3] = uStack_98._4_4_ + uStack_b8._4_4_;
      pfVar14[4] = (float)uStack_90 + (float)uStack_b0;
      pfVar14[5] = uStack_90._4_4_ + uStack_b0._4_4_;
      pfVar14[6] = (float)uStack_88 + (float)uStack_a8;
      pfVar14[7] = uStack_88._4_4_ + uStack_a8._4_4_;
      local_c0 = uVar4;
      uStack_b8 = uVar5;
      uStack_b0 = uVar6;
      uStack_a8 = uVar7;
      local_a0 = uVar8;
      uStack_98 = uVar9;
      uStack_90 = uVar10;
      uStack_88 = uVar11;
    }
    for (local_4d8 = 0; local_4d8 < 1; local_4d8 = local_4d8 + 1) {
      puVar13 = (undefined8 *)(local_3c0 + (long)(local_4d8 << 2) * 0x20 + (long)local_4d0 * 0x80);
      local_e0 = *puVar13;
      uStack_d8 = puVar13[1];
      uStack_d0 = puVar13[2];
      uStack_c8 = puVar13[3];
      puVar13 = (undefined8 *)
                (local_3c0 + (long)(local_4d8 * 4 + 2) * 0x20 + (long)local_4d0 * 0x80);
      local_100 = *puVar13;
      uStack_f8 = puVar13[1];
      uStack_f0 = puVar13[2];
      uStack_e8 = puVar13[3];
      uVar8 = local_e0;
      uVar9 = uStack_d8;
      uVar10 = uStack_d0;
      uVar11 = uStack_c8;
      uVar4 = local_100;
      uVar5 = uStack_f8;
      uVar6 = uStack_f0;
      uVar7 = uStack_e8;
      local_e0._4_4_ = (float)((ulong)local_e0 >> 0x20);
      uStack_d8._4_4_ = (float)((ulong)uStack_d8 >> 0x20);
      uStack_d0._4_4_ = (float)((ulong)uStack_d0 >> 0x20);
      uStack_c8._4_4_ = (float)((ulong)uStack_c8 >> 0x20);
      local_100._4_4_ = (float)((ulong)local_100 >> 0x20);
      uStack_f8._4_4_ = (float)((ulong)uStack_f8 >> 0x20);
      uStack_f0._4_4_ = (float)((ulong)uStack_f0 >> 0x20);
      uStack_e8._4_4_ = (float)((ulong)uStack_e8 >> 0x20);
      pfVar14 = (float *)(local_3c0 + (long)(local_4d8 << 2) * 0x20 + (long)local_4d0 * 0x80);
      *pfVar14 = (float)local_e0 + (float)local_100;
      pfVar14[1] = local_e0._4_4_ + local_100._4_4_;
      pfVar14[2] = (float)uStack_d8 + (float)uStack_f8;
      pfVar14[3] = uStack_d8._4_4_ + uStack_f8._4_4_;
      pfVar14[4] = (float)uStack_d0 + (float)uStack_f0;
      pfVar14[5] = uStack_d0._4_4_ + uStack_f0._4_4_;
      pfVar14[6] = (float)uStack_c8 + (float)uStack_e8;
      pfVar14[7] = uStack_c8._4_4_ + uStack_e8._4_4_;
      local_100 = uVar4;
      uStack_f8 = uVar5;
      uStack_f0 = uVar6;
      uStack_e8 = uVar7;
      local_e0 = uVar8;
      uStack_d8 = uVar9;
      uStack_d0 = uVar10;
      uStack_c8 = uVar11;
    }
    for (local_4dc = 0; local_4dc < 0; local_4dc = local_4dc + 1) {
      puVar13 = (undefined8 *)(local_3c0 + (long)(local_4dc << 3) * 0x20 + (long)local_4d0 * 0x80);
      local_120 = *puVar13;
      uStack_118 = puVar13[1];
      uStack_110 = puVar13[2];
      uStack_108 = puVar13[3];
      puVar13 = (undefined8 *)
                (local_3c0 + (long)(local_4dc * 8 + 4) * 0x20 + (long)local_4d0 * 0x80);
      local_140 = *puVar13;
      uStack_138 = puVar13[1];
      uStack_130 = puVar13[2];
      uStack_128 = puVar13[3];
      uVar8 = local_120;
      uVar9 = uStack_118;
      uVar10 = uStack_110;
      uVar11 = uStack_108;
      uVar4 = local_140;
      uVar5 = uStack_138;
      uVar6 = uStack_130;
      uVar7 = uStack_128;
      local_120._4_4_ = (float)((ulong)local_120 >> 0x20);
      uStack_118._4_4_ = (float)((ulong)uStack_118 >> 0x20);
      uStack_110._4_4_ = (float)((ulong)uStack_110 >> 0x20);
      uStack_108._4_4_ = (float)((ulong)uStack_108 >> 0x20);
      local_140._4_4_ = (float)((ulong)local_140 >> 0x20);
      uStack_138._4_4_ = (float)((ulong)uStack_138 >> 0x20);
      uStack_130._4_4_ = (float)((ulong)uStack_130 >> 0x20);
      uStack_128._4_4_ = (float)((ulong)uStack_128 >> 0x20);
      fVar17 = (float)local_120 + (float)local_140;
      fVar19 = local_120._4_4_ + local_140._4_4_;
      fVar20 = (float)uStack_118 + (float)uStack_138;
      fVar21 = uStack_118._4_4_ + uStack_138._4_4_;
      fVar22 = (float)uStack_110 + (float)uStack_130;
      fVar23 = uStack_110._4_4_ + uStack_130._4_4_;
      fVar24 = (float)uStack_108 + (float)uStack_128;
      fVar25 = uStack_108._4_4_ + uStack_128._4_4_;
      pfVar14 = (float *)(local_3c0 + (long)(local_4dc << 3) * 0x20 + (long)local_4d0 * 0x80);
      local_140 = uVar4;
      uStack_138 = uVar5;
      uStack_130 = uVar6;
      uStack_128 = uVar7;
      local_120 = uVar8;
      uStack_118 = uVar9;
      uStack_110 = uVar10;
      uStack_108 = uVar11;
      *pfVar14 = fVar17;
      pfVar14[1] = fVar19;
      pfVar14[2] = fVar20;
      pfVar14[3] = fVar21;
      pfVar14[4] = fVar22;
      pfVar14[5] = fVar23;
      pfVar14[6] = fVar24;
      pfVar14[7] = fVar25;
    }
    lVar15 = (long)local_4d0 * 0x80;
    local_260 = *(undefined8 *)(local_3c0 + lVar15);
    uStack_258 = *(undefined8 *)(local_3c0 + lVar15 + 8);
    uStack_250 = *(undefined8 *)(local_3c0 + lVar15 + 0x10);
    uStack_248 = *(undefined8 *)(local_3a0 + lVar15 + -8);
    local_180 = *(undefined8 *)(local_3c0 + lVar15);
    uStack_178 = *(undefined8 *)(local_3c0 + lVar15 + 8);
    uStack_178 = *(undefined8 *)(local_3a0 + (long)local_4d0 * 0x80 + -8);
    local_180 = *(undefined8 *)(local_3c0 + (long)local_4d0 * 0x80 + 0x10);
    uVar4 = local_180;
    uVar5 = uStack_178;
    local_180._4_4_ = (float)((ulong)local_180 >> 0x20);
    uStack_178._4_4_ = (float)((ulong)uStack_178 >> 0x20);
    local_40 = CONCAT44(local_180._4_4_ + fStack_18c,(float)local_180 + local_190);
    uStack_38 = CONCAT44(uStack_178._4_4_ + fStack_184,(float)uStack_178 + fStack_188);
    local_50 = local_40;
    uStack_48 = uStack_38;
    auVar3._8_8_ = uStack_38;
    auVar3._0_8_ = local_40;
    auVar18._8_8_ = uStack_38;
    auVar18._0_8_ = local_40;
    auVar18 = vhaddps_avx(auVar3,auVar18);
    local_500 = auVar18._0_8_;
    uStack_4f8 = auVar18._8_8_;
    local_60 = local_500;
    uStack_58 = uStack_4f8;
    local_70 = local_500;
    uStack_68 = uStack_4f8;
    local_230 = vhaddps_avx(auVar18,auVar18);
    auVar18 = local_230;
    local_290[local_4d0] = (double)(float)local_230._0_4_;
    local_230 = auVar18;
    local_180 = uVar4;
    uStack_178 = uVar5;
  }
  for (local_504 = local_2a8; (int)local_504 < (int)local_264; local_504 = local_504 + 1) {
    for (local_508 = 0; local_508 < 2; local_508 = local_508 + 1) {
      fVar17 = ggml_lookup_fp16_to_fp32
                         (*(ggml_fp16_t *)(alStack_2a0[local_508] + (long)(int)local_504 * 2));
      fVar19 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(local_280 + (long)(int)local_504 * 2));
      local_290[local_508] = (double)(fVar17 * fVar19) + local_290[local_508];
    }
  }
  for (local_50c = 0; local_50c < 2; local_50c = local_50c + 1) {
    *(float *)(local_270 + (long)local_50c * 4) = (float)local_290[local_50c];
  }
  return;
}

Assistant:

inline static void ggml_vec_dot_f16_unroll(const int n, const int xs, float * restrict s, void * restrict xv, ggml_fp16_t * restrict y) {
    ggml_float sumf[GGML_VEC_DOT_UNROLL] = { 0.0 };

    ggml_fp16_t * restrict x[GGML_VEC_DOT_UNROLL];

    for (int i = 0; i < GGML_VEC_DOT_UNROLL; ++i) {
        x[i] = (ggml_fp16_t *) ((char *) xv + i*xs);
    }

#if defined(GGML_SIMD)
    const int np = (n & ~(GGML_F16_STEP - 1));

    GGML_F16_VEC sum[GGML_VEC_DOT_UNROLL][GGML_F16_ARR] = { { GGML_F16_VEC_ZERO } };

    GGML_F16_VEC ax[GGML_F16_ARR];
    GGML_F16_VEC ay[GGML_F16_ARR];

    for (int i = 0; i < np; i += GGML_F16_STEP) {
        for (int j = 0; j < GGML_F16_ARR; j++) {
            ay[j] = GGML_F16_VEC_LOAD(y + i + j*GGML_F16_EPR, j);

            for (int k = 0; k < GGML_VEC_DOT_UNROLL; ++k) {
                ax[j] = GGML_F16_VEC_LOAD(x[k] + i + j*GGML_F16_EPR, j);

                sum[k][j] = GGML_F16_VEC_FMA(sum[k][j], ax[j], ay[j]);
            }
        }
    }

    // reduce sum0..sum3 to sum0
    for (int k = 0; k < GGML_VEC_DOT_UNROLL; ++k) {
        GGML_F16_VEC_REDUCE(sumf[k], sum[k]);
    }

    // leftovers
    for (int i = np; i < n; ++i) {
        for (int j = 0; j < GGML_VEC_DOT_UNROLL; ++j) {
            sumf[j] += GGML_FP16_TO_FP32(x[j][i])*GGML_FP16_TO_FP32(y[i]);
        }
    }
#else
    for (int i = 0; i < n; ++i) {
        for (int j = 0; j < GGML_VEC_DOT_UNROLL; ++j) {
            sumf[j] += GGML_FP16_TO_FP32(x[j][i])*GGML_FP16_TO_FP32(y[i]);
        }
    }
#endif

    for (int i = 0; i < GGML_VEC_DOT_UNROLL; ++i) {
        s[i] = sumf[i];
    }
}